

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O0

void grd_stcheck(grd_st_t *grd_st,uint32_t len)

{
  double *pdVar1;
  void *pvVar2;
  uint in_ESI;
  long *in_RDI;
  uint32_t T;
  uint32_t Y;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 uVar3;
  
  if ((in_ESI == 0) || ((*(uint *)(in_RDI + 1) < in_ESI && ((int)in_RDI[1] != 0)))) {
    if ((*(byte *)(*(long *)*in_RDI + 0x59) & 1) != 0) {
      xvm_free((double *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      in_RDI[5] = 0;
      free((void *)in_RDI[6]);
      in_RDI[6] = 0;
      free((void *)in_RDI[7]);
      in_RDI[7] = 0;
      free((void *)in_RDI[8]);
      in_RDI[8] = 0;
    }
    xvm_free((double *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    in_RDI[4] = 0;
    xvm_free((double *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    in_RDI[9] = 0;
    xvm_free((double *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    in_RDI[10] = 0;
    xvm_free((double *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    in_RDI[0xc] = 0;
    xvm_free((double *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    in_RDI[0xd] = 0;
    xvm_free((double *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    in_RDI[0xb] = 0;
    *(undefined4 *)(in_RDI + 1) = 0;
  }
  if ((in_ESI != 0) && (*(uint *)(in_RDI + 1) < in_ESI)) {
    uVar3 = *(undefined4 *)(*in_RDI + 0xc);
    pdVar1 = xvm_new(CONCAT44(in_ESI,uVar3));
    in_RDI[4] = (long)pdVar1;
    pdVar1 = xvm_new(CONCAT44(in_ESI,uVar3));
    in_RDI[9] = (long)pdVar1;
    pdVar1 = xvm_new(CONCAT44(in_ESI,uVar3));
    in_RDI[10] = (long)pdVar1;
    pdVar1 = xvm_new(CONCAT44(in_ESI,uVar3));
    in_RDI[0xb] = (long)pdVar1;
    pdVar1 = xvm_new(CONCAT44(in_ESI,uVar3));
    in_RDI[0xc] = (long)pdVar1;
    pdVar1 = xvm_new(CONCAT44(in_ESI,uVar3));
    in_RDI[0xd] = (long)pdVar1;
    if ((*(byte *)(*(long *)*in_RDI + 0x59) & 1) != 0) {
      pdVar1 = xvm_new(CONCAT44(in_ESI,uVar3));
      in_RDI[5] = (long)pdVar1;
      pvVar2 = xmalloc(CONCAT44(in_ESI,uVar3));
      in_RDI[6] = (long)pvVar2;
      pvVar2 = xmalloc(CONCAT44(in_ESI,uVar3));
      in_RDI[7] = (long)pvVar2;
      pvVar2 = xmalloc(CONCAT44(in_ESI,uVar3));
      in_RDI[8] = (long)pvVar2;
    }
    *(uint *)(in_RDI + 1) = in_ESI;
  }
  return;
}

Assistant:

void grd_stcheck(grd_st_t *grd_st, uint32_t len) {
	// Check if user ask for clearing the state tracker or if he requested a
	// bigger tracker. In this case we have to free the previous allocated
	// memory.
	if (len == 0 || (len > grd_st->len && grd_st->len != 0)) {
		if (grd_st->mdl->opt->sparse) {
			xvm_free(grd_st->psiuni); grd_st->psiuni = NULL;
			free(grd_st->psiyp);      grd_st->psiyp  = NULL;
			free(grd_st->psiidx);     grd_st->psiidx = NULL;
			free(grd_st->psioff);     grd_st->psioff = NULL;
		}
		xvm_free(grd_st->psi);   grd_st->psi   = NULL;
		xvm_free(grd_st->alpha); grd_st->alpha = NULL;
		xvm_free(grd_st->beta);  grd_st->beta  = NULL;
		xvm_free(grd_st->unorm); grd_st->unorm = NULL;
		xvm_free(grd_st->bnorm); grd_st->bnorm = NULL;
		xvm_free(grd_st->scale); grd_st->scale = NULL;
		grd_st->len = 0;
	}
	if (len == 0 || len <= grd_st->len)
		return;
	// If we are here, we have to allocate a new state. This is simple, we
	// just have to take care of the special case for sparse mode.
	const uint32_t Y = grd_st->mdl->nlbl;
	const uint32_t T = len;
	grd_st->psi   = xvm_new(T * Y * Y);
	grd_st->alpha = xvm_new(T * Y);
	grd_st->beta  = xvm_new(T * Y);
	grd_st->scale = xvm_new(T);
	grd_st->unorm = xvm_new(T);
	grd_st->bnorm = xvm_new(T);
	if (grd_st->mdl->opt->sparse) {
		grd_st->psiuni = xvm_new(T * Y);
		grd_st->psiyp  = xmalloc(sizeof(uint32_t) * T * Y * Y);
		grd_st->psiidx = xmalloc(sizeof(uint32_t) * T * Y);
		grd_st->psioff = xmalloc(sizeof(uint32_t) * T);
	}
	grd_st->len = len;
}